

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  int iVar2;
  BLOCK *pBVar3;
  XML_Char *pXVar4;
  ulong uVar5;
  XML_Char *pXVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  pBVar3 = pool->freeBlocks;
  if (pBVar3 == (BLOCK *)0x0) {
LAB_00168e72:
    pBVar3 = pool->blocks;
    pXVar4 = pool->start;
    iVar8 = (int)pool->end;
    if (pXVar4 == pBVar3->s && pBVar3 != (BLOCK *)0x0) {
      iVar2 = 0;
      uVar9 = (iVar8 - (int)pXVar4) * 2;
      if ((int)uVar9 < 0) goto LAB_00168fd8;
      iVar8 = uVar9 + 0xc;
      if ((int)(uVar9 + 0xc) < 1) {
        iVar8 = iVar2;
      }
      if (iVar8 == 0 || uVar9 == 0) goto LAB_00168fd8;
      pXVar6 = pool->ptr;
      pBVar3 = (BLOCK *)(*pool->mem->realloc_fcn)(pBVar3,(size_t)iVar8);
      if (pBVar3 != (BLOCK *)0x0) {
        pool->blocks = pBVar3;
        pBVar3->size = uVar9;
        pool->ptr = pXVar6 + (long)pBVar3 + (0xc - (long)pXVar4);
        pool->start = pBVar3->s;
        uVar5 = (ulong)uVar9;
        goto LAB_00168ef7;
      }
    }
    else {
      uVar9 = iVar8 - (int)pXVar4;
      if ((-1 < (int)uVar9) &&
         ((uVar10 = 0x400, uVar9 < 0x400 || (uVar10 = uVar9 * 2, -1 < (int)uVar10)))) {
        iVar2 = 0;
        iVar8 = uVar10 + 0xc;
        if ((int)(uVar10 + 0xc) < 1) {
          iVar8 = 0;
        }
        if (iVar8 == 0) goto LAB_00168fd8;
        pBVar3 = (BLOCK *)(*pool->mem->malloc_fcn)((size_t)iVar8);
        if (pBVar3 != (BLOCK *)0x0) {
          pBVar3->size = uVar10;
          pBVar3->next = pool->blocks;
          pool->blocks = pBVar3;
          pXVar4 = pool->ptr;
          sVar7 = (long)pXVar4 - (long)pool->start;
          pXVar6 = pXVar4;
          if (sVar7 != 0) {
            memcpy(pBVar3->s,pool->start,sVar7);
            pXVar6 = pool->ptr;
            pXVar4 = pool->start;
          }
          pool->ptr = pXVar6 + (0xc - (long)pXVar4) + (long)(pBVar3->s + -0xc);
          pool->start = pBVar3->s;
          pXVar4 = pBVar3->s + ((ulong)uVar10 - 0xc);
          goto LAB_00168efe;
        }
      }
    }
    iVar2 = 0;
  }
  else {
    pXVar4 = pool->start;
    if (pXVar4 == (XML_Char *)0x0) {
      pool->blocks = pBVar3;
      pool->freeBlocks = pBVar3->next;
      pBVar3->next = (block *)0x0;
      pool->start = pBVar3->s;
      pool->end = pBVar3->s + pBVar3->size;
      pool->ptr = pBVar3->s;
    }
    else {
      sVar7 = (long)pool->end - (long)pXVar4;
      if ((long)pBVar3->size <= (long)sVar7) goto LAB_00168e72;
      pbVar1 = pBVar3->next;
      pBVar3->next = pool->blocks;
      pool->blocks = pBVar3;
      pool->freeBlocks = pbVar1;
      memcpy(pBVar3->s,pXVar4,sVar7);
      pBVar3 = pool->blocks;
      pool->ptr = pool->ptr + (long)pBVar3 + (0xc - (long)pool->start);
      pool->start = pBVar3->s;
      uVar5 = (ulong)pBVar3->size;
LAB_00168ef7:
      pXVar4 = pBVar3->s + (uVar5 - 0xc);
LAB_00168efe:
      pool->end = pXVar4 + 0xc;
    }
    iVar2 = 1;
  }
LAB_00168fd8:
  return (XML_Bool)iVar2;
}

Assistant:

static XML_Bool FASTCALL
poolGrow(STRING_POOL *pool) {
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = NULL;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return XML_TRUE;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start,
             (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return XML_TRUE;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    BLOCK *temp;
    int blockSize = (int)((unsigned)(pool->end - pool->start) * 2U);
    size_t bytesToAllocate;

    /* NOTE: Needs to be calculated prior to calling `realloc`
             to avoid dangling pointers: */
    const ptrdiff_t offsetInsideBlock = pool->ptr - pool->start;

    if (blockSize < 0) {
      /* This condition traps a situation where either more than
       * INT_MAX/2 bytes have already been allocated.  This isn't
       * readily testable, since it is unlikely that an average
       * machine will have that much memory, so we exclude it from the
       * coverage statistics.
       */
      return XML_FALSE; /* LCOV_EXCL_LINE */
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    temp = (BLOCK *)pool->mem->realloc_fcn(pool->blocks,
                                           (unsigned)bytesToAllocate);
    if (temp == NULL)
      return XML_FALSE;
    pool->blocks = temp;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + offsetInsideBlock;
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  } else {
    BLOCK *tem;
    int blockSize = (int)(pool->end - pool->start);
    size_t bytesToAllocate;

    if (blockSize < 0) {
      /* This condition traps a situation where either more than
       * INT_MAX bytes have already been allocated (which is prevented
       * by various pieces of program logic, not least this one, never
       * mind the unlikelihood of actually having that much memory) or
       * the pool control fields have been corrupted (which could
       * conceivably happen in an extremely buggy user handler
       * function).  Either way it isn't readily testable, so we
       * exclude it from the coverage statistics.
       */
      return XML_FALSE; /* LCOV_EXCL_LINE */
    }

    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else {
      /* Detect overflow, avoiding _signed_ overflow undefined behavior */
      if ((int)((unsigned)blockSize * 2U) < 0) {
        return XML_FALSE;
      }
      blockSize *= 2;
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    tem = pool->mem->malloc_fcn(bytesToAllocate);
    if (! tem)
      return XML_FALSE;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start, (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return XML_TRUE;
}